

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Get_count(MPIABI_Status *status,MPIABI_Datatype datatype,int *count)

{
  int iVar1;
  WPI_const_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Get_count();
  WPI_const_StatusPtr::~WPI_const_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Get_count(
  const MPIABI_Status * status,
  MPIABI_Datatype datatype,
  int * count
) {
  return MPI_Get_count(
    (const MPI_Status *)(WPI_const_StatusPtr)status,
    (MPI_Datatype)(WPI_Datatype)datatype,
    count
  );
}